

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

_Bool art_iterator_lower_bound(art_iterator_t *iterator,art_key_chunk_t *key)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  art_ref_t ref;
  
  if (iterator->value == (art_val_t *)0x0) {
    iterator->depth = '\0';
    iterator->frame = '\0';
    ref = iterator->frames[0].ref;
    if (ref == 0) {
      return false;
    }
    goto LAB_0010fdcb;
  }
  uVar3 = *(uint *)iterator->key;
  uVar4 = *(uint *)key;
  uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  if (uVar3 == uVar4) {
    uVar3 = (uint)(ushort)(*(ushort *)(iterator->key + 4) << 8 | *(ushort *)(iterator->key + 4) >> 8
                          );
    uVar4 = (uint)(ushort)(*(ushort *)(key + 4) << 8 | *(ushort *)(key + 4) >> 8);
    uVar6 = 0;
    if (uVar3 != uVar4) goto LAB_0010fd1c;
  }
  else {
LAB_0010fd1c:
    uVar6 = -(uint)(uVar3 < uVar4) | 1;
  }
  if (uVar6 != 0) {
    _Var2 = art_iterator_up(iterator);
    if (_Var2) {
      do {
        uVar1 = iterator->frames[iterator->frame].ref;
        uVar5 = (ulong)(((uint)uVar1 & 0xff) << 3);
        uVar6 = memcmp(iterator,key,
                       (ulong)(byte)(*(char *)(*(long *)((long)iterator->art->nodes + uVar5) +
                                              (uVar1 >> 0x10) *
                                              *(long *)((long)ART_NODE_SIZES + uVar5)) +
                                    iterator->depth));
        if (uVar6 == 0) goto LAB_0010fdbf;
        _Var2 = art_iterator_up(iterator);
      } while (_Var2);
    }
    if ((int)uVar6 < 0) {
      iterator->key[4] = '\0';
      iterator->key[5] = '\0';
      iterator->key[0] = '\0';
      iterator->key[1] = '\0';
      iterator->key[2] = '\0';
      iterator->key[3] = '\0';
      iterator->value = (art_val_t *)0x0;
      return false;
    }
    art_node_init_iterator(iterator->frames[iterator->frame].ref,iterator,true);
    return true;
  }
LAB_0010fdbf:
  ref = iterator->frames[iterator->frame].ref;
LAB_0010fdcb:
  _Var2 = art_node_iterator_lower_bound(ref,iterator,key);
  return _Var2;
}

Assistant:

bool art_iterator_lower_bound(art_iterator_t *iterator,
                              const art_key_chunk_t *key) {
    if (iterator->value == NULL) {
        // We're beyond the end / start of the ART so the iterator does not
        // have a valid key. Start from the root.
        iterator->frame = 0;
        iterator->depth = 0;
        art_ref_t root = art_iterator_ref(iterator);
        if (root == CROARING_ART_NULL_REF) {
            return false;
        }
        return art_node_iterator_lower_bound(root, iterator, key);
    }
    int compare_result =
        art_compare_prefix(iterator->key, 0, key, 0, ART_KEY_BYTES);
    // Move up until we have an equal prefix, after which we can do a normal
    // lower bound search.
    while (compare_result != 0) {
        if (!art_iterator_up(iterator)) {
            if (compare_result < 0) {
                // Only smaller keys found.
                return art_iterator_invalid_loc(iterator);
            } else {
                return art_node_init_iterator(art_iterator_ref(iterator),
                                              iterator, true);
            }
        }
        // Since we're only moving up, we can keep comparing against the
        // iterator key.
        art_inner_node_t *inner_node =
            (art_inner_node_t *)art_iterator_node(iterator);
        compare_result =
            art_compare_prefix(iterator->key, 0, key, 0,
                               iterator->depth + inner_node->prefix_size);
    }
    if (compare_result > 0) {
        return art_node_init_iterator(art_iterator_ref(iterator), iterator,
                                      true);
    }
    return art_node_iterator_lower_bound(art_iterator_ref(iterator), iterator,
                                         key);
}